

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboteqInterface.cpp
# Opt level: O1

int handleroboteqinterface(RS232PORT *pRoboteqInterfacePseudoRS232Port)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  char *pcVar5;
  char *pcVar6;
  double *pdVar7;
  uint uVar8;
  void *__buf;
  ulong uVar9;
  bool bVar10;
  int chan;
  int spd;
  char recvbuf [2048];
  int local_840;
  int local_83c;
  timespec local_838 [128];
  
  local_840 = 0;
  local_83c = 0;
  if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
    local_838[0].tv_sec = 0;
    iVar2 = ioctl(pRoboteqInterfacePseudoRS232Port->s,0x541b,local_838);
    bVar10 = local_838[0].tv_sec == 0;
  }
  else {
    cVar1 = '\x01';
    if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_001966e6;
    local_838[0].tv_sec = local_838[0].tv_sec & 0xffffffff00000000;
    iVar2 = ioctl(*(int *)&pRoboteqInterfacePseudoRS232Port->hDev,0x541b,local_838);
    bVar10 = (int)local_838[0].tv_sec < 1;
  }
  cVar1 = '\x01';
  if (iVar2 == 0) {
    cVar1 = bVar10 * '\x02';
  }
LAB_001966e6:
  if (cVar1 != '\0') {
    local_838[0].tv_sec = 0;
    local_838[0].tv_nsec = 50000000;
    nanosleep(local_838,(timespec *)0x0);
    return 0;
  }
  sVar4 = 0;
  memset(local_838,0,0x800);
  iVar2 = 0;
  while ((iVar2 < 1 || (*(char *)((long)&local_838[0].tv_sec + (ulong)(iVar2 - 1)) != '\r'))) {
    if (0x7ff < iVar2) {
      return 1;
    }
    __buf = (void *)((long)&local_838[0].tv_sec + (long)iVar2);
    if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
      sVar4 = recv(pRoboteqInterfacePseudoRS232Port->s,__buf,1,0);
LAB_0019678b:
      bVar10 = (int)sVar4 < 1;
    }
    else {
      bVar10 = true;
      if (pRoboteqInterfacePseudoRS232Port->DevType == 0) {
        sVar4 = read(*(int *)&pRoboteqInterfacePseudoRS232Port->hDev,__buf,1);
        goto LAB_0019678b;
      }
    }
    if (bVar10) {
      return 1;
    }
    iVar2 = iVar2 + (int)sVar4;
    if ((int)sVar4 == 0) {
      return 1;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  for (pcVar5 = strchr((char *)local_838,0x3f); pcVar5 != (char *)0x0;
      pcVar5 = strchr(pcVar5 + 1,0x3f)) {
    iVar2 = strncmp(pcVar5,"?FID",4);
    if (iVar2 == 0) {
      pcVar6 = strchr(pcVar5,0xd);
      if (pcVar6 == (char *)0x0) goto LAB_00196c06;
      uVar3 = (int)pcVar6 - (int)pcVar5;
      uVar8 = uVar3 + 1;
      if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
        if (uVar3 < 0x7fffffff) {
          iVar2 = pRoboteqInterfacePseudoRS232Port->s;
          uVar9 = 0;
          do {
            sVar4 = send(iVar2,pcVar5 + uVar9,(long)(int)(uVar8 - (int)uVar9),0);
            if ((int)sVar4 < 1) goto LAB_00196c06;
            uVar3 = (int)uVar9 + (int)sVar4;
            uVar9 = (ulong)uVar3;
          } while ((int)uVar3 < (int)uVar8);
        }
      }
      else {
        if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_00196c06;
        if (uVar8 != 0) {
          iVar2 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
          uVar9 = 0;
          do {
            sVar4 = write(iVar2,pcVar5 + uVar9,(ulong)(uVar8 - (int)uVar9));
            if ((int)sVar4 < 1) goto LAB_00196c06;
            uVar3 = (int)uVar9 + (int)sVar4;
            uVar9 = (ulong)uVar3;
          } while (uVar3 < uVar8);
        }
      }
      if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
        iVar2 = pRoboteqInterfacePseudoRS232Port->s;
        uVar9 = 0;
        do {
          sVar4 = send(iVar2,"FID=Roboteq v0.0 EMULATED 12/12/2023\r" + uVar9,
                       (long)(0x25 - (int)uVar9),0);
          if ((int)sVar4 < 1) goto LAB_00196c06;
          uVar8 = (int)uVar9 + (int)sVar4;
          uVar9 = (ulong)uVar8;
        } while ((int)uVar8 < 0x25);
      }
      else {
        if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_00196c06;
        iVar2 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
        uVar9 = 0;
        do {
          sVar4 = write(iVar2,"FID=Roboteq v0.0 EMULATED 12/12/2023\r" + uVar9,
                        (ulong)(0x25 - (int)uVar9));
          if ((int)sVar4 < 1) goto LAB_00196c06;
          uVar8 = (int)uVar9 + (int)sVar4;
          uVar9 = (ulong)uVar8;
        } while (uVar8 < 0x25);
      }
    }
    if (0x7fd < (long)local_838 - (long)pcVar5) break;
  }
  for (pcVar5 = strchr((char *)local_838,0x21); pcVar5 != (char *)0x0;
      pcVar5 = strchr(pcVar5 + 1,0x21)) {
    iVar2 = __isoc99_sscanf(pcVar5,"!G %d %d",&local_840,&local_83c);
    if ((iVar2 == 2) ||
       (iVar2 = __isoc99_sscanf(pcVar5,"!$00 %d %d",&local_840,&local_83c), iVar2 == 2)) {
      pcVar6 = strchr(pcVar5,0xd);
      if (pcVar6 == (char *)0x0) {
LAB_00196c06:
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        return 1;
      }
      uVar3 = (int)pcVar6 - (int)pcVar5;
      uVar8 = uVar3 + 1;
      if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
        if (uVar3 < 0x7fffffff) {
          iVar2 = pRoboteqInterfacePseudoRS232Port->s;
          uVar9 = 0;
          do {
            sVar4 = send(iVar2,pcVar5 + uVar9,(long)(int)(uVar8 - (int)uVar9),0);
            if ((int)sVar4 < 1) goto LAB_00196c06;
            uVar3 = (int)uVar9 + (int)sVar4;
            uVar9 = (ulong)uVar3;
          } while ((int)uVar3 < (int)uVar8);
        }
      }
      else {
        if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_00196c06;
        if (uVar8 != 0) {
          iVar2 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
          uVar9 = 0;
          do {
            sVar4 = write(iVar2,pcVar5 + uVar9,(ulong)(uVar8 - (int)uVar9));
            if ((int)sVar4 < 1) goto LAB_00196c06;
            uVar3 = (int)uVar9 + (int)sVar4;
            uVar9 = (ulong)uVar3;
          } while (uVar3 < uVar8);
        }
      }
      if (pRoboteqInterfacePseudoRS232Port->DevType - 1U < 4) {
        iVar2 = pRoboteqInterfacePseudoRS232Port->s;
        uVar8 = 0;
        do {
          sVar4 = send(iVar2,"+\r" + uVar8,(long)(int)(2 - uVar8),0);
          if ((int)sVar4 < 1) goto LAB_00196c06;
          uVar8 = uVar8 + (int)sVar4;
        } while ((int)uVar8 < 2);
      }
      else {
        if (pRoboteqInterfacePseudoRS232Port->DevType != 0) goto LAB_00196c06;
        iVar2 = *(int *)&pRoboteqInterfacePseudoRS232Port->hDev;
        uVar8 = 0;
        do {
          sVar4 = write(iVar2,"+\r" + uVar8,(ulong)(2 - uVar8));
          if ((int)sVar4 < 1) goto LAB_00196c06;
          uVar8 = uVar8 + (int)sVar4;
        } while (uVar8 < 2);
      }
      if (robid < 0x8000) {
        if (((robid != 0x1000) && (robid != 0x2000)) && (robid != 0x4000)) {
LAB_00196b9c:
          pdVar7 = &roboteq_u1;
          if (local_840 == 1) {
LAB_00196bb8:
            *pdVar7 = (double)local_83c / 1000.0;
          }
          else if (local_840 == 2) {
            pdVar7 = &roboteq_u2;
            goto LAB_00196bb8;
          }
          u = (roboteq_u1 + roboteq_u2) * 0.5;
          uw = (roboteq_u2 - roboteq_u1) * 0.5;
          goto LAB_00196b69;
        }
      }
      else if (((robid != 0x8000) && (robid != 0x200000)) && (robid != 0x100000)) goto LAB_00196b9c;
      pdVar7 = &roboteq_u1;
      if (local_840 == 1) {
LAB_00196b31:
        *pdVar7 = (double)local_83c / 1000.0;
      }
      else if (local_840 == 2) {
        pdVar7 = &roboteq_u2;
        goto LAB_00196b31;
      }
      u = roboteq_u2;
      uw = roboteq_u1;
    }
LAB_00196b69:
    if (0x7fd < (long)local_838 - (long)pcVar5) break;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  return 0;
}

Assistant:

int handleroboteqinterface(RS232PORT* pRoboteqInterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_ROBOTEQ, chan = 0, spd = 0;
	char endchar = '\r';
	char* tmp = NULL;
	char* tmp2 = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pRoboteqInterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		// To improve...

		tmp = strstr(recvbuf, "?");
		while (tmp)
		{
			if (strncmp(tmp, "?FID", strlen("?FID")) == 0)
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("FID=Roboteq v0.0 EMULATED 12/12/2023\r"), strlen("FID=Roboteq v0.0 EMULATED 12/12/2023\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "?");
		}

		tmp = strstr(recvbuf, "!");
		while (tmp)
		{
			if ((sscanf(tmp, "!G %d %d", &chan, &spd) == 2)||(sscanf(tmp, "!$00 %d %d", &chan, &spd) == 2))
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("+\r"), strlen("+\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
	
				// Not thread-safe...

				switch (robid)
				{
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case SAILBOAT2_ROBID:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = roboteq_u2;
					uw = roboteq_u1;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
				default:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = (roboteq_u1+roboteq_u2)/2;
					uw = (roboteq_u2-roboteq_u1)/2;
					break;
				}

			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "!");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else 
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}